

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  Variable *pVVar3;
  ResourceTestCase *pRVar4;
  LayoutQualifier *pLVar5;
  ArrayElement *pAVar6;
  StorageQualifier *pSVar7;
  Node *pNVar8;
  SharedPtr *this;
  SharedPtr variable;
  SharedPtr variable_3;
  SharedPtr layout;
  SharedPtr variable_5;
  SharedPtr output;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar8 = parentStructure->m_ptr;
  NVar1 = pNVar8->m_type;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pSVar7 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar7,parentStructure,STORAGE_OUT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&output,(Node *)pSVar7);
  }
  else {
    output.m_state = parentStructure->m_state;
    output.m_ptr = pNVar8;
    if (output.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (output.m_state)->strongRefCount = (output.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (output.m_state)->weakRefCount = (output.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskLastStage(presentShadersMask);
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar2 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar2 != SHADERTYPE_TESSELLATION_CONTROL) {
      if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_01300035;
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&output,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pVVar3);
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&layout,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&layout,"var");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      pLVar5 = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pLVar5);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&layout,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pVVar3);
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20)
      ;
      ResourceTestCase::ResourceTestCase
                (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,
                 "var_explicit_location");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&layout);
      pAVar6 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&output,-1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar6);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pVVar3);
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20)
      ;
      ResourceTestCase::ResourceTestCase
                (pRVar4,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      pLVar5 = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout((Layout *)&variable,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pLVar5);
      pAVar6 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&layout,-1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar6);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_3,(Node *)pVVar3);
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20)
      ;
      ResourceTestCase::ResourceTestCase
                (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
                 "var_array_explicit_location");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      goto LAB_01300017;
    }
    pSVar7 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar7,parentStructure,STORAGE_PATCH_OUT)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pSVar7);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&output,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar5);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&variable_3,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar4,context,&variable_5,&local_38,"var_explicit_location")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&layout,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,"patch_var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar5);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable_3,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar5);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_5,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&layout,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar5);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&variable_3,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_5,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    this = &variable_3;
  }
  else {
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&output,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&layout,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar5);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&layout,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,
               "var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&output);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar5);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&output,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar5 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar5,&output,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar5);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,&layout,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar3);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "var_array_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
LAB_01300017:
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    this = &variable;
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(this);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&layout);
LAB_01300035:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&output);
  return;
}

Assistant:

static void generateProgramOutputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(1)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}